

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RandomHelper.h
# Opt level: O1

mt19937 * random_engine(void)

{
  uint uVar1;
  undefined8 in_RAX;
  undefined8 uVar2;
  mt19937 *pmVar3;
  ulong uVar4;
  size_t __i;
  long lVar5;
  
  uVar2 = CONCAT71((int7)((ulong)in_RAX >> 8),random_engine()::random_device);
  if (random_engine()::random_device == '\0') {
    uVar2 = __cxa_guard_acquire(&random_engine()::random_device);
    if ((int)uVar2 != 0) {
      std::random_device::random_device(&random_engine::random_device);
      __cxa_atexit(std::random_device::~random_device,&random_engine::random_device,&__dso_handle);
      uVar2 = __cxa_guard_release(&random_engine()::random_device);
    }
  }
  pmVar3 = (mt19937 *)CONCAT71((int7)((ulong)uVar2 >> 8),random_engine()::smt);
  if (random_engine()::smt == '\0') {
    pmVar3 = (mt19937 *)__cxa_guard_acquire(&random_engine()::smt);
    if ((int)pmVar3 != 0) {
      uVar1 = std::random_device::_M_getval();
      uVar4 = (ulong)uVar1;
      lVar5 = 1;
      random_engine::smt._M_x[0] = uVar4;
      do {
        uVar4 = (ulong)(((uint)(uVar4 >> 0x1e) ^ (uint)uVar4) * 0x6c078965 + (int)lVar5);
        random_engine::smt._M_x[lVar5] = uVar4;
        lVar5 = lVar5 + 1;
      } while (lVar5 != 0x270);
      random_engine::smt._M_p = 0x270;
      pmVar3 = (mt19937 *)__cxa_guard_release(&random_engine()::smt);
      return pmVar3;
    }
  }
  return pmVar3;
}

Assistant:

static std::mt19937& random_engine() {
    static std::random_device random_device;
    static std::mt19937 smt(random_device());
    return smt;
}